

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLMaterialLoader.cpp
# Opt level: O0

void __thiscall
Assimp::MDLImporter::ParseSkinLump_3DGS_MDL7
          (MDLImporter *this,uchar *szCurrent,uchar **szCurrentOut,aiMaterial *pcMatOut,uint iType,
          uint iWidth,uint iHeight)

{
  char *__s;
  uint uVar1;
  uchar uVar2;
  bool bVar3;
  Logger *pLVar4;
  aiTexture *paVar5;
  aiTexel *paVar6;
  size_t sVar7;
  aiTexture **ppaVar8;
  pointer paVar9;
  aiTexture **ppaVar10;
  aiColor4D aVar11;
  bool local_95a;
  size_t local_938;
  uint local_8e4;
  uint i;
  aiTexture **pc_1;
  size_t iLen_1;
  undefined1 local_8c8 [4];
  aiString szFile_1;
  int iStack_4c0;
  char szCurrent_1 [5];
  int32_t iMe;
  float power;
  int iShadingMode;
  aiColor3D clrTemp;
  Material_MDL7 *pcMatIn;
  undefined1 local_48c [8];
  aiColor4D clrTexture;
  uint iSkip;
  aiTexel *pc;
  uint local_468;
  uint uStack_464;
  bool bSet;
  uint y;
  uint x;
  size_t iLen2;
  size_t iLen;
  aiString szFile;
  uint local_40;
  uint local_3c;
  int referrer;
  uint iMasked;
  unique_ptr<aiTexture,_std::default_delete<aiTexture>_> pcNew;
  uint iWidth_local;
  uint iType_local;
  aiMaterial *pcMatOut_local;
  uchar **szCurrentOut_local;
  uchar *szCurrent_local;
  MDLImporter *this_local;
  
  pcNew._M_t.super___uniq_ptr_impl<aiTexture,_std::default_delete<aiTexture>_>._M_t.
  super__Tuple_impl<0UL,_aiTexture_*,_std::default_delete<aiTexture>_>.
  super__Head_base<0UL,_aiTexture_*,_false>._M_head_impl._0_4_ = iWidth;
  pcNew._M_t.super___uniq_ptr_impl<aiTexture,_std::default_delete<aiTexture>_>._M_t.
  super__Tuple_impl<0UL,_aiTexture_*,_std::default_delete<aiTexture>_>.
  super__Head_base<0UL,_aiTexture_*,_false>._M_head_impl._4_4_ = iType;
  std::unique_ptr<aiTexture,std::default_delete<aiTexture>>::
  unique_ptr<std::default_delete<aiTexture>,void>
            ((unique_ptr<aiTexture,std::default_delete<aiTexture>> *)&referrer);
  local_3c = pcNew._M_t.super___uniq_ptr_impl<aiTexture,_std::default_delete<aiTexture>_>._M_t.
             super__Tuple_impl<0UL,_aiTexture_*,_std::default_delete<aiTexture>_>.
             super__Head_base<0UL,_aiTexture_*,_false>._M_head_impl._4_4_ & 0xf;
  szCurrentOut_local = (uchar **)szCurrent;
  if (local_3c == 1) {
    local_40 = (uint)pcNew._M_t.super___uniq_ptr_impl<aiTexture,_std::default_delete<aiTexture>_>.
                     _M_t.super__Tuple_impl<0UL,_aiTexture_*,_std::default_delete<aiTexture>_>.
                     super__Head_base<0UL,_aiTexture_*,_false>._M_head_impl;
    aiMaterial::AddProperty<int>(pcMatOut,(int *)&local_40,1,"&&&referrer&&&",0,0);
  }
  else if (local_3c == 6) {
    if (iHeight != 1) {
      pLVar4 = DefaultLogger::get();
      Logger::warn(pLVar4,
                   "Found a reference to an embedded DDS texture, but texture height is not equal to 1, which is not supported by MED"
                  );
    }
    paVar5 = (aiTexture *)operator_new(0x428);
    aiTexture::aiTexture(paVar5);
    std::unique_ptr<aiTexture,_std::default_delete<aiTexture>_>::reset
              ((unique_ptr<aiTexture,_std::default_delete<aiTexture>_> *)&referrer,paVar5);
    paVar9 = std::unique_ptr<aiTexture,_std::default_delete<aiTexture>_>::operator->
                       ((unique_ptr<aiTexture,_std::default_delete<aiTexture>_> *)&referrer);
    uVar1 = (uint)pcNew._M_t.super___uniq_ptr_impl<aiTexture,_std::default_delete<aiTexture>_>._M_t.
                  super__Tuple_impl<0UL,_aiTexture_*,_std::default_delete<aiTexture>_>.
                  super__Head_base<0UL,_aiTexture_*,_false>._M_head_impl;
    paVar9->mHeight = 0;
    paVar9 = std::unique_ptr<aiTexture,_std::default_delete<aiTexture>_>::operator->
                       ((unique_ptr<aiTexture,_std::default_delete<aiTexture>_> *)&referrer);
    paVar9->mWidth = uVar1;
    paVar9 = std::unique_ptr<aiTexture,_std::default_delete<aiTexture>_>::operator->
                       ((unique_ptr<aiTexture,_std::default_delete<aiTexture>_> *)&referrer);
    paVar9->achFormatHint[0] = 'd';
    paVar9 = std::unique_ptr<aiTexture,_std::default_delete<aiTexture>_>::operator->
                       ((unique_ptr<aiTexture,_std::default_delete<aiTexture>_> *)&referrer);
    paVar9->achFormatHint[1] = 'd';
    paVar9 = std::unique_ptr<aiTexture,_std::default_delete<aiTexture>_>::operator->
                       ((unique_ptr<aiTexture,_std::default_delete<aiTexture>_> *)&referrer);
    paVar9->achFormatHint[2] = 's';
    paVar9 = std::unique_ptr<aiTexture,_std::default_delete<aiTexture>_>::operator->
                       ((unique_ptr<aiTexture,_std::default_delete<aiTexture>_> *)&referrer);
    paVar9->achFormatHint[3] = '\0';
    paVar9 = std::unique_ptr<aiTexture,_std::default_delete<aiTexture>_>::operator->
                       ((unique_ptr<aiTexture,_std::default_delete<aiTexture>_> *)&referrer);
    paVar6 = (aiTexel *)operator_new__((ulong)paVar9->mWidth);
    paVar9 = std::unique_ptr<aiTexture,_std::default_delete<aiTexture>_>::operator->
                       ((unique_ptr<aiTexture,_std::default_delete<aiTexture>_> *)&referrer);
    paVar9->pcData = paVar6;
    paVar9 = std::unique_ptr<aiTexture,_std::default_delete<aiTexture>_>::operator->
                       ((unique_ptr<aiTexture,_std::default_delete<aiTexture>_> *)&referrer);
    paVar6 = paVar9->pcData;
    paVar9 = std::unique_ptr<aiTexture,_std::default_delete<aiTexture>_>::operator->
                       ((unique_ptr<aiTexture,_std::default_delete<aiTexture>_> *)&referrer);
    memcpy(paVar6,szCurrent,(ulong)paVar9->mWidth);
    szCurrentOut_local =
         (uchar **)
         (szCurrent +
         (uint)pcNew._M_t.super___uniq_ptr_impl<aiTexture,_std::default_delete<aiTexture>_>._M_t.
               super__Tuple_impl<0UL,_aiTexture_*,_std::default_delete<aiTexture>_>.
               super__Head_base<0UL,_aiTexture_*,_false>._M_head_impl);
  }
  else if (local_3c == 7) {
    if (iHeight != 1) {
      pLVar4 = DefaultLogger::get();
      Logger::warn(pLVar4,
                   "Found a reference to an external texture, but texture height is not equal to 1, which is not supported by MED"
                  );
    }
    aiString::aiString((aiString *)&iLen);
    sVar7 = strlen((char *)szCurrent);
    local_938 = sVar7 + 1;
    if (0x400 < local_938) {
      local_938 = 0x400;
    }
    memcpy((void *)((long)&iLen + 4),szCurrent,local_938);
    iLen2._0_4_ = (undefined4)sVar7;
    iLen._0_4_ = (undefined4)iLen2;
    szCurrentOut_local = (uchar **)(szCurrent + local_938);
    aiMaterial::AddProperty(pcMatOut,(aiString *)&iLen,"$tex.file",1,0);
  }
  else if (((local_3c != 0) ||
           (pcNew._M_t.super___uniq_ptr_impl<aiTexture,_std::default_delete<aiTexture>_>._M_t.
            super__Tuple_impl<0UL,_aiTexture_*,_std::default_delete<aiTexture>_>.
            super__Head_base<0UL,_aiTexture_*,_false>._M_head_impl._4_4_ == 0)) ||
          ((pcNew._M_t.super___uniq_ptr_impl<aiTexture,_std::default_delete<aiTexture>_>._M_t.
            super__Tuple_impl<0UL,_aiTexture_*,_std::default_delete<aiTexture>_>.
            super__Head_base<0UL,_aiTexture_*,_false>._M_head_impl._4_4_ != 0 &&
           (((uint)pcNew._M_t.super___uniq_ptr_impl<aiTexture,_std::default_delete<aiTexture>_>._M_t
                   .super__Tuple_impl<0UL,_aiTexture_*,_std::default_delete<aiTexture>_>.
                   super__Head_base<0UL,_aiTexture_*,_false>._M_head_impl != 0 && (iHeight != 0)))))
          ) {
    paVar5 = (aiTexture *)operator_new(0x428);
    aiTexture::aiTexture(paVar5);
    std::unique_ptr<aiTexture,_std::default_delete<aiTexture>_>::reset
              ((unique_ptr<aiTexture,_std::default_delete<aiTexture>_> *)&referrer,paVar5);
    uVar1 = (uint)pcNew._M_t.super___uniq_ptr_impl<aiTexture,_std::default_delete<aiTexture>_>._M_t.
                  super__Tuple_impl<0UL,_aiTexture_*,_std::default_delete<aiTexture>_>.
                  super__Head_base<0UL,_aiTexture_*,_false>._M_head_impl;
    if ((iHeight == 0) ||
       ((uint)pcNew._M_t.super___uniq_ptr_impl<aiTexture,_std::default_delete<aiTexture>_>._M_t.
              super__Tuple_impl<0UL,_aiTexture_*,_std::default_delete<aiTexture>_>.
              super__Head_base<0UL,_aiTexture_*,_false>._M_head_impl == 0)) {
      pLVar4 = DefaultLogger::get();
      Logger::warn(pLVar4,
                   "Found embedded texture, but its width an height are both 0. Is this a joke?");
      paVar9 = std::unique_ptr<aiTexture,_std::default_delete<aiTexture>_>::operator->
                         ((unique_ptr<aiTexture,_std::default_delete<aiTexture>_> *)&referrer);
      paVar9->mHeight = 8;
      paVar9 = std::unique_ptr<aiTexture,_std::default_delete<aiTexture>_>::operator->
                         ((unique_ptr<aiTexture,_std::default_delete<aiTexture>_> *)&referrer);
      paVar9->mWidth = 8;
      paVar6 = (aiTexel *)operator_new__(0x100);
      paVar9 = std::unique_ptr<aiTexture,_std::default_delete<aiTexture>_>::operator->
                         ((unique_ptr<aiTexture,_std::default_delete<aiTexture>_> *)&referrer);
      paVar9->pcData = paVar6;
      for (uStack_464 = 0; uStack_464 < 8; uStack_464 = uStack_464 + 1) {
        for (local_468 = 0; local_468 < 8; local_468 = local_468 + 1) {
          if (((uStack_464 & 1) != 0) || (local_95a = true, (local_468 & 1) == 0)) {
            local_95a = (uStack_464 & 1) != 0 && (local_468 & 1) == 0;
          }
          paVar9 = std::unique_ptr<aiTexture,_std::default_delete<aiTexture>_>::operator->
                             ((unique_ptr<aiTexture,_std::default_delete<aiTexture>_> *)&referrer);
          register0x00000000 = paVar9->pcData + (local_468 * 8 + uStack_464);
          uVar2 = '\0';
          if (local_95a) {
            uVar2 = 0xff;
          }
          register0x00000000->g = uVar2;
          register0x00000000->b = uVar2;
          register0x00000000->r = uVar2;
          register0x00000000->a = 0xff;
        }
      }
    }
    else {
      paVar9 = std::unique_ptr<aiTexture,_std::default_delete<aiTexture>_>::operator->
                         ((unique_ptr<aiTexture,_std::default_delete<aiTexture>_> *)&referrer);
      paVar9->mWidth = uVar1;
      paVar9 = std::unique_ptr<aiTexture,_std::default_delete<aiTexture>_>::operator->
                         ((unique_ptr<aiTexture,_std::default_delete<aiTexture>_> *)&referrer);
      uVar1 = local_3c;
      paVar9->mHeight = iHeight;
      clrTexture.b = 0.0;
      paVar9 = std::unique_ptr<aiTexture,_std::default_delete<aiTexture>_>::get
                         ((unique_ptr<aiTexture,_std::default_delete<aiTexture>_> *)&referrer);
      ParseTextureColorData(this,szCurrent,uVar1,(uint *)&clrTexture.b,paVar9);
      szCurrentOut_local = (uchar **)(szCurrent + (uint)clrTexture.b);
    }
  }
  aiColor4t<float>::aiColor4t((aiColor4t<float> *)local_48c);
  bVar3 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&referrer);
  if (bVar3) {
    paVar9 = std::unique_ptr<aiTexture,_std::default_delete<aiTexture>_>::get
                       ((unique_ptr<aiTexture,_std::default_delete<aiTexture>_> *)&referrer);
    aVar11 = ReplaceTextureWithColor(this,paVar9);
    clrTexture._0_8_ = aVar11._8_8_;
    local_48c = aVar11._0_8_;
  }
  else {
    local_48c._0_4_ = get_qnan();
  }
  if ((pcNew._M_t.super___uniq_ptr_impl<aiTexture,_std::default_delete<aiTexture>_>._M_t.
       super__Tuple_impl<0UL,_aiTexture_*,_std::default_delete<aiTexture>_>.
       super__Head_base<0UL,_aiTexture_*,_false>._M_head_impl._4_4_ & 0x10) == 0) {
    bVar3 = is_not_qnan<float>((float)local_48c._0_4_);
    if (bVar3) {
      aiMaterial::AddProperty<aiColor4t<float>>
                (pcMatOut,(aiColor4D *)local_48c,1,"$clr.diffuse",0,0);
      aiMaterial::AddProperty<aiColor4t<float>>
                (pcMatOut,(aiColor4D *)local_48c,1,"$clr.specular",0,0);
    }
  }
  else {
    clrTemp._4_8_ = szCurrentOut_local;
    szCurrentOut_local = (uchar **)((long)szCurrentOut_local + 0x44);
    SizeCheck(this,szCurrentOut_local,
              "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLMaterialLoader.cpp"
              ,0x25b);
    aiColor3D::aiColor3D((aiColor3D *)&power);
    power = *(float *)clrTemp._4_8_;
    iShadingMode = *(int *)(clrTemp._4_8_ + 4);
    clrTemp.r = *(ai_real *)(clrTemp._4_8_ + 8);
    bVar3 = is_not_qnan<float>((float)local_48c._0_4_);
    if (bVar3) {
      power = (float)local_48c._0_4_ * power;
      iShadingMode = (int)((float)local_48c._4_4_ * (float)iShadingMode);
      clrTemp.r = clrTexture.r * clrTemp.r;
    }
    aiMaterial::AddProperty<aiColor3D>(pcMatOut,(aiColor3D *)&power,1,"$clr.diffuse",0,0);
    power = *(float *)(clrTemp._4_8_ + 0x20);
    iShadingMode = *(int *)(clrTemp._4_8_ + 0x24);
    clrTemp.r = *(ai_real *)(clrTemp._4_8_ + 0x28);
    bVar3 = is_not_qnan<float>((float)local_48c._0_4_);
    if (bVar3) {
      power = (float)local_48c._0_4_ * power;
      iShadingMode = (int)((float)local_48c._4_4_ * (float)iShadingMode);
      clrTemp.r = clrTexture.r * clrTemp.r;
    }
    aiMaterial::AddProperty<aiColor3D>(pcMatOut,(aiColor3D *)&power,1,"$clr.specular",0,0);
    power = *(float *)(clrTemp._4_8_ + 0x10);
    iShadingMode = *(int *)(clrTemp._4_8_ + 0x14);
    clrTemp.r = *(ai_real *)(clrTemp._4_8_ + 0x18);
    bVar3 = is_not_qnan<float>((float)local_48c._0_4_);
    if (bVar3) {
      power = (float)local_48c._0_4_ * power;
      iShadingMode = (int)((float)local_48c._4_4_ * (float)iShadingMode);
      clrTemp.r = clrTexture.r * clrTemp.r;
    }
    aiMaterial::AddProperty<aiColor3D>(pcMatOut,(aiColor3D *)&power,1,"$clr.ambient",0,0);
    power = *(float *)(clrTemp._4_8_ + 0x30);
    iShadingMode = *(int *)(clrTemp._4_8_ + 0x34);
    clrTemp.r = *(ai_real *)(clrTemp._4_8_ + 0x38);
    aiMaterial::AddProperty<aiColor3D>(pcMatOut,(aiColor3D *)&power,1,"$clr.emissive",0,0);
    power = *(float *)(clrTemp._4_8_ + 0x1c);
    bVar3 = is_not_qnan<float>((float)local_48c._0_4_);
    if (bVar3) {
      power = clrTexture.g * power;
    }
    aiMaterial::AddProperty<float>(pcMatOut,&power,1,"$mat.opacity",0,0);
    iMe = 2;
    if ((*(float *)(clrTemp._4_8_ + 0x40) != 0.0) || (NAN(*(float *)(clrTemp._4_8_ + 0x40)))) {
      iMe = 3;
      szCurrent_1._1_4_ = *(undefined4 *)(clrTemp._4_8_ + 0x40);
      aiMaterial::AddProperty<float>
                (pcMatOut,(float *)((char *)((long)register0x00000020 + -0x4bd) + 1),1,
                 "$mat.shininess",0,0);
    }
    aiMaterial::AddProperty<int>(pcMatOut,&iMe,1,"$mat.shadingm",0,0);
  }
  bVar3 = is_not_qnan<float>((float)local_48c._0_4_);
  if (bVar3) {
    std::unique_ptr<aiTexture,_std::default_delete<aiTexture>_>::reset
              ((unique_ptr<aiTexture,_std::default_delete<aiTexture>_> *)&referrer,(pointer)0x0);
  }
  if ((pcNew._M_t.super___uniq_ptr_impl<aiTexture,_std::default_delete<aiTexture>_>._M_t.
       super__Tuple_impl<0UL,_aiTexture_*,_std::default_delete<aiTexture>_>.
       super__Head_base<0UL,_aiTexture_*,_false>._M_head_impl._4_4_ & 0x20) != 0) {
    SizeCheck(this,szCurrentOut_local,
              "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLMaterialLoader.cpp"
              ,0x2b6);
    iStack_4c0 = *(int *)szCurrentOut_local;
    szCurrentOut_local = (uchar **)((long)iStack_4c0 + 4 + (long)szCurrentOut_local);
    SizeCheck(this,szCurrentOut_local,
              "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLMaterialLoader.cpp"
              ,0x2ba);
  }
  bVar3 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&referrer);
  if ((bVar3) && (this->pScene->mNumTextures < 1000)) {
    __s = szFile_1.data + 0x3fb;
    snprintf(__s,5,"*%i",(ulong)this->pScene->mNumTextures);
    aiString::aiString((aiString *)((long)&iLen_1 + 4));
    sVar7 = strlen(__s);
    memcpy(local_8c8,__s,sVar7 + 1);
    pc_1._0_4_ = (undefined4)sVar7;
    iLen_1._4_4_ = pc_1._0_4_;
    aiMaterial::AddProperty(pcMatOut,(aiString *)((long)&iLen_1 + 4),"$tex.file",1,0);
    if (this->pScene->mNumTextures == 0) {
      this->pScene->mNumTextures = 1;
      ppaVar8 = (aiTexture **)operator_new__(8);
      this->pScene->mTextures = ppaVar8;
      paVar9 = std::unique_ptr<aiTexture,_std::default_delete<aiTexture>_>::release
                         ((unique_ptr<aiTexture,_std::default_delete<aiTexture>_> *)&referrer);
      *this->pScene->mTextures = paVar9;
    }
    else {
      ppaVar8 = this->pScene->mTextures;
      ppaVar10 = (aiTexture **)operator_new__((ulong)(this->pScene->mNumTextures + 1) << 3);
      this->pScene->mTextures = ppaVar10;
      for (local_8e4 = 0; local_8e4 < this->pScene->mNumTextures; local_8e4 = local_8e4 + 1) {
        this->pScene->mTextures[local_8e4] = ppaVar8[local_8e4];
      }
      paVar9 = std::unique_ptr<aiTexture,_std::default_delete<aiTexture>_>::release
                         ((unique_ptr<aiTexture,_std::default_delete<aiTexture>_> *)&referrer);
      this->pScene->mTextures[this->pScene->mNumTextures] = paVar9;
      this->pScene->mNumTextures = this->pScene->mNumTextures + 1;
      if (ppaVar8 != (aiTexture **)0x0) {
        operator_delete__(ppaVar8);
      }
    }
  }
  SizeCheck(this,szCurrentOut_local,
            "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLMaterialLoader.cpp"
            ,0x2e1);
  *szCurrentOut = (uchar *)szCurrentOut_local;
  std::unique_ptr<aiTexture,_std::default_delete<aiTexture>_>::~unique_ptr
            ((unique_ptr<aiTexture,_std::default_delete<aiTexture>_> *)&referrer);
  return;
}

Assistant:

void MDLImporter::ParseSkinLump_3DGS_MDL7(
    const unsigned char* szCurrent,
    const unsigned char** szCurrentOut,
    aiMaterial* pcMatOut,
    unsigned int iType,
    unsigned int iWidth,
    unsigned int iHeight)
{
    std::unique_ptr<aiTexture> pcNew;

    // get the type of the skin
    unsigned int iMasked = (unsigned int)(iType & 0xF);

    if (0x1 ==  iMasked)
    {
        // ***** REFERENCE TO ANOTHER SKIN INDEX *****
        int referrer = (int)iWidth;
        pcMatOut->AddProperty<int>(&referrer,1,AI_MDL7_REFERRER_MATERIAL);
    }
    else if (0x6 == iMasked)
    {
        // ***** EMBEDDED DDS FILE *****
        if (1 != iHeight)
        {
            ASSIMP_LOG_WARN("Found a reference to an embedded DDS texture, "
                "but texture height is not equal to 1, which is not supported by MED");
        }

        pcNew.reset(new aiTexture());
        pcNew->mHeight = 0;
        pcNew->mWidth = iWidth;

        // place a proper format hint
        pcNew->achFormatHint[0] = 'd';
        pcNew->achFormatHint[1] = 'd';
        pcNew->achFormatHint[2] = 's';
        pcNew->achFormatHint[3] = '\0';

        pcNew->pcData = (aiTexel*) new unsigned char[pcNew->mWidth];
        memcpy(pcNew->pcData,szCurrent,pcNew->mWidth);
        szCurrent += iWidth;
    }
    else if (0x7 == iMasked)
    {
        // ***** REFERENCE TO EXTERNAL FILE *****
        if (1 != iHeight)
        {
            ASSIMP_LOG_WARN("Found a reference to an external texture, "
                "but texture height is not equal to 1, which is not supported by MED");
        }

        aiString szFile;
        const size_t iLen = strlen((const char*)szCurrent);
        size_t iLen2 = iLen+1;
        iLen2 = iLen2 > MAXLEN ? MAXLEN : iLen2;
        memcpy(szFile.data,(const char*)szCurrent,iLen2);
        szFile.length = iLen;

        szCurrent += iLen2;

        // place this as diffuse texture
        pcMatOut->AddProperty(&szFile,AI_MATKEY_TEXTURE_DIFFUSE(0));
    }
    else if (iMasked || !iType || (iType && iWidth && iHeight))
    {
        pcNew.reset(new aiTexture());
        if (!iHeight || !iWidth)
        {
            ASSIMP_LOG_WARN("Found embedded texture, but its width "
                "an height are both 0. Is this a joke?");

            // generate an empty chess pattern
            pcNew->mWidth = pcNew->mHeight = 8;
            pcNew->pcData = new aiTexel[64];
            for (unsigned int x = 0; x < 8;++x)
            {
                for (unsigned int y = 0; y < 8;++y)
                {
                    const bool bSet = ((0 == x % 2 && 0 != y % 2) ||
                        (0 != x % 2 && 0 == y % 2));

                    aiTexel* pc = &pcNew->pcData[y * 8 + x];
                    pc->r = pc->b = pc->g = (bSet?0xFF:0);
                    pc->a = 0xFF;
                }
            }
        }
        else
        {
            // it is a standard color texture. Fill in width and height
            // and call the same function we used for loading MDL5 files

            pcNew->mWidth = iWidth;
            pcNew->mHeight = iHeight;

            unsigned int iSkip = 0;
            ParseTextureColorData(szCurrent,iMasked,&iSkip,pcNew.get());

            // skip length of texture data
            szCurrent += iSkip;
        }
    }

    // sometimes there are MDL7 files which have a monochrome
    // texture instead of material colors ... posssible they have
    // been converted to MDL7 from other formats, such as MDL5
    aiColor4D clrTexture;
    if (pcNew)clrTexture = ReplaceTextureWithColor(pcNew.get());
    else clrTexture.r = get_qnan();

    // check whether a material definition is contained in the skin
    if (iType & AI_MDL7_SKINTYPE_MATERIAL)
    {
        BE_NCONST MDL::Material_MDL7* pcMatIn = (BE_NCONST MDL::Material_MDL7*)szCurrent;
        szCurrent = (unsigned char*)(pcMatIn+1);
        VALIDATE_FILE_SIZE(szCurrent);

        aiColor3D clrTemp;

#define COLOR_MULTIPLY_RGB() \
    if (is_not_qnan(clrTexture.r)) \
        { \
        clrTemp.r *= clrTexture.r; \
        clrTemp.g *= clrTexture.g; \
        clrTemp.b *= clrTexture.b; \
        }

        // read diffuse color
        clrTemp.r = pcMatIn->Diffuse.r;
        AI_SWAP4(clrTemp.r);
        clrTemp.g = pcMatIn->Diffuse.g;
        AI_SWAP4(clrTemp.g);
        clrTemp.b = pcMatIn->Diffuse.b;
        AI_SWAP4(clrTemp.b);
        COLOR_MULTIPLY_RGB();
        pcMatOut->AddProperty<aiColor3D>(&clrTemp,1,AI_MATKEY_COLOR_DIFFUSE);

        // read specular color
        clrTemp.r = pcMatIn->Specular.r;
        AI_SWAP4(clrTemp.r);
        clrTemp.g = pcMatIn->Specular.g;
        AI_SWAP4(clrTemp.g);
        clrTemp.b = pcMatIn->Specular.b;
        AI_SWAP4(clrTemp.b);
        COLOR_MULTIPLY_RGB();
        pcMatOut->AddProperty<aiColor3D>(&clrTemp,1,AI_MATKEY_COLOR_SPECULAR);

        // read ambient color
        clrTemp.r = pcMatIn->Ambient.r;
        AI_SWAP4(clrTemp.r);
        clrTemp.g = pcMatIn->Ambient.g;
        AI_SWAP4(clrTemp.g);
        clrTemp.b = pcMatIn->Ambient.b;
        AI_SWAP4(clrTemp.b);
        COLOR_MULTIPLY_RGB();
        pcMatOut->AddProperty<aiColor3D>(&clrTemp,1,AI_MATKEY_COLOR_AMBIENT);

        // read emissive color
        clrTemp.r = pcMatIn->Emissive.r;
        AI_SWAP4(clrTemp.r);
        clrTemp.g = pcMatIn->Emissive.g;
        AI_SWAP4(clrTemp.g);
        clrTemp.b = pcMatIn->Emissive.b;
        AI_SWAP4(clrTemp.b);
        pcMatOut->AddProperty<aiColor3D>(&clrTemp,1,AI_MATKEY_COLOR_EMISSIVE);

#undef COLOR_MULITPLY_RGB

        // FIX: Take the opacity from the ambient color.
        // The doc say something else, but it is fact that MED exports the
        // opacity like this .... oh well.
        clrTemp.r = pcMatIn->Ambient.a;
        AI_SWAP4(clrTemp.r);
        if (is_not_qnan(clrTexture.r)) {
            clrTemp.r *= clrTexture.a;
        }
        pcMatOut->AddProperty<ai_real>(&clrTemp.r,1,AI_MATKEY_OPACITY);

        // read phong power
        int iShadingMode = (int)aiShadingMode_Gouraud;
        AI_SWAP4(pcMatIn->Power);
        if (0.0f != pcMatIn->Power)
        {
            iShadingMode = (int)aiShadingMode_Phong;
            // pcMatIn is packed, we can't form pointers to its members
            float power = pcMatIn->Power;
            pcMatOut->AddProperty<float>(&power,1,AI_MATKEY_SHININESS);
        }
        pcMatOut->AddProperty<int>(&iShadingMode,1,AI_MATKEY_SHADING_MODEL);
    }
    else if (is_not_qnan(clrTexture.r))
    {
        pcMatOut->AddProperty<aiColor4D>(&clrTexture,1,AI_MATKEY_COLOR_DIFFUSE);
        pcMatOut->AddProperty<aiColor4D>(&clrTexture,1,AI_MATKEY_COLOR_SPECULAR);
    }
    // if the texture could be replaced by a single material color
    // we don't need the texture anymore
    if (is_not_qnan(clrTexture.r))
    {
        pcNew.reset();
    }

    // If an ASCII effect description (HLSL?) is contained in the file,
    // we can simply ignore it ...
    if (iType & AI_MDL7_SKINTYPE_MATERIAL_ASCDEF)
    {
        VALIDATE_FILE_SIZE(szCurrent);
        int32_t iMe = *((int32_t*)szCurrent);
        AI_SWAP4(iMe);
        szCurrent += sizeof(char) * iMe + sizeof(int32_t);
        VALIDATE_FILE_SIZE(szCurrent);
    }

    // If an embedded texture has been loaded setup the corresponding
    // data structures in the aiScene instance
    if (pcNew && pScene->mNumTextures <= 999)
    {

        // place this as diffuse texture
        char szCurrent[5];
        ai_snprintf(szCurrent,5,"*%i",this->pScene->mNumTextures);

        aiString szFile;
        const size_t iLen = strlen((const char*)szCurrent);
        ::memcpy(szFile.data,(const char*)szCurrent,iLen+1);
        szFile.length = iLen;

        pcMatOut->AddProperty(&szFile,AI_MATKEY_TEXTURE_DIFFUSE(0));

        // store the texture
        if (!pScene->mNumTextures)
        {
            pScene->mNumTextures = 1;
            pScene->mTextures = new aiTexture*[1];
            pScene->mTextures[0] = pcNew.release();
        }
        else
        {
            aiTexture** pc = pScene->mTextures;
            pScene->mTextures = new aiTexture*[pScene->mNumTextures+1];
            for (unsigned int i = 0; i < pScene->mNumTextures;++i) {
                pScene->mTextures[i] = pc[i];
            }

            pScene->mTextures[pScene->mNumTextures] = pcNew.release();
            pScene->mNumTextures++;
            delete[] pc;
        }
    }
    VALIDATE_FILE_SIZE(szCurrent);
    *szCurrentOut = szCurrent;
}